

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs,CrtAllocator *allocator,bool copyConstStrings)

{
  Type TVar1;
  SizeType SVar2;
  Ch *str;
  StringRefType local_50;
  uint local_3c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGStack_38;
  SizeType i;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *re;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *le;
  SizeType count;
  bool copyConstStrings_local;
  CrtAllocator *allocator_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  le._7_1_ = copyConstStrings;
  _count = allocator;
  allocator_local = (CrtAllocator *)rhs;
  rhs_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this;
  TVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetType(rhs);
  if (TVar1 == kObjectType) {
    DoCopyMembers<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)allocator_local,_count,(bool)(le._7_1_ & 1));
  }
  else if (TVar1 == kArrayType) {
    le._0_4_ = *(uint *)allocator_local;
    re = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *)CrtAllocator::Malloc(_count,(ulong)(uint)le << 4);
    pGStack_38 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetElementsPointer
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)allocator_local);
    for (local_3c = 0; local_3c < (uint)le; local_3c = local_3c + 1) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)(re + local_3c),
                 pGStack_38 + local_3c,_count,(bool)(le._7_1_ & 1));
    }
    *(undefined2 *)(this + 0xe) = 4;
    *(uint *)(this + 4) = (uint)le;
    *(uint *)this = (uint)le;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetElementsPointer
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)re);
  }
  else if (TVar1 == kStringType) {
    if ((*(short *)(allocator_local + 0xe) == 0x405) && ((le._7_1_ & 1) == 0)) {
      *(undefined2 *)(this + 0xe) = *(undefined2 *)(allocator_local + 0xe);
      *(undefined8 *)this = *(undefined8 *)allocator_local;
      *(undefined8 *)(this + 8) = *(undefined8 *)(allocator_local + 8);
    }
    else {
      str = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)allocator_local);
      SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)allocator_local);
      StringRef<char>((rapidjson *)&local_50,str,(ulong)SVar2);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetStringRaw
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&local_50,
                 _count);
    }
  }
  else {
    *(undefined2 *)(this + 0xe) = *(undefined2 *)(allocator_local + 0xe);
    *(undefined8 *)this = *(undefined8 *)allocator_local;
    *(undefined8 *)(this + 8) = *(undefined8 *)(allocator_local + 8);
  }
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType:
            DoCopyMembers(rhs, allocator, copyConstStrings);
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }